

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sscUtil.c
# Opt level: O1

Gia_Man_t * Gia_ManDropContained(Gia_Man_t *p)

{
  int iVar1;
  lit *begin;
  int iVar2;
  Aig_Man_t *pAig;
  Cnf_Dat_t *p_00;
  Vec_Int_t *p_01;
  int *piVar3;
  sat_solver *s;
  Vec_Int_t *pVVar4;
  Vec_Int_t *pVVar5;
  Gia_Man_t *pGVar6;
  ulong uVar7;
  int iVar8;
  long lVar9;
  
  pAig = Gia_ManToAigSimple(p);
  p_00 = Cnf_Derive(pAig,p->vCos->nSize - p->nRegs);
  iVar1 = *p_00->pVarNums;
  if (iVar1 < 0) {
LAB_0059872b:
    __assert_fail("Var >= 0 && !(c >> 1)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/util/abc_global.h"
                  ,0x10b,"int Abc_Var2Lit(int, int)");
  }
  Aig_ManStop(pAig);
  iVar8 = p->vCos->nSize - p->nRegs;
  p_01 = (Vec_Int_t *)malloc(0x10);
  iVar2 = 0x10;
  if (0xe < iVar8 - 1U) {
    iVar2 = iVar8;
  }
  p_01->nSize = 0;
  p_01->nCap = iVar2;
  if (iVar2 == 0) {
    piVar3 = (int *)0x0;
  }
  else {
    piVar3 = (int *)malloc((long)iVar2 << 2);
  }
  p_01->pArray = piVar3;
  pVVar4 = p->vCos;
  uVar7 = (ulong)(uint)pVVar4->nSize;
  if (p->nRegs < pVVar4->nSize) {
    lVar9 = 0;
    do {
      if ((int)uVar7 <= lVar9) goto LAB_0059870c;
      iVar2 = pVVar4->pArray[lVar9];
      if (((long)iVar2 < 0) || (p->nObjs <= iVar2)) goto LAB_005986ed;
      if (p->pObjs == (Gia_Obj_t *)0x0) break;
      if (p_00->pVarNums[iVar2] < 0) goto LAB_0059872b;
      Vec_IntPush(p_01,p_00->pVarNums[iVar2] * 2 + 1);
      lVar9 = lVar9 + 1;
      pVVar4 = p->vCos;
      uVar7 = (ulong)pVVar4->nSize;
    } while (lVar9 < (long)(uVar7 - (long)p->nRegs));
  }
  s = sat_solver_new();
  sat_solver_setnvars(s,p_00->nVars);
  lVar9 = 0;
  while (lVar9 < p_00->nClauses) {
    iVar2 = sat_solver_addclause(s,p_00->pClauses[lVar9],p_00->pClauses[lVar9 + 1]);
    lVar9 = lVar9 + 1;
    if (iVar2 == 0) {
      Cnf_DataFree(p_00);
LAB_0059852a:
      sat_solver_delete(s);
      if (p_01->pArray != (int *)0x0) {
        free(p_01->pArray);
        p_01->pArray = (int *)0x0;
      }
      free(p_01);
      return (Gia_Man_t *)0x0;
    }
  }
  Cnf_DataFree(p_00);
  iVar2 = sat_solver_simplify(s);
  if (iVar2 == 0) goto LAB_0059852a;
  iVar8 = p->vCos->nSize - p->nRegs;
  pVVar4 = (Vec_Int_t *)malloc(0x10);
  iVar2 = 0x10;
  if (0xe < iVar8 - 1U) {
    iVar2 = iVar8;
  }
  pVVar4->nSize = 0;
  pVVar4->nCap = iVar2;
  if (iVar2 == 0) {
    piVar3 = (int *)0x0;
  }
  else {
    piVar3 = (int *)malloc((long)iVar2 << 2);
  }
  pVVar4->pArray = piVar3;
  pVVar5 = p->vCos;
  uVar7 = (ulong)(uint)pVVar5->nSize;
  if (p->nRegs < pVVar5->nSize) {
    lVar9 = 0;
    do {
      if ((int)uVar7 <= lVar9) {
LAB_0059870c:
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/vec/vecInt.h"
                      ,0x19e,"int Vec_IntEntry(Vec_Int_t *, int)");
      }
      if ((pVVar5->pArray[lVar9] < 0) || (p->nObjs <= pVVar5->pArray[lVar9])) {
LAB_005986ed:
        __assert_fail("v >= 0 && v < p->nObjs",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/gia/gia.h"
                      ,0x1a3,"Gia_Obj_t *Gia_ManObj(Gia_Man_t *, int)");
      }
      if (p->pObjs == (Gia_Obj_t *)0x0) break;
      iVar2 = p_01->nSize;
      if (iVar2 <= lVar9) goto LAB_0059870c;
      begin = p_01->pArray;
      if (begin[lVar9] < 0) {
LAB_0059874a:
        __assert_fail("Lit >= 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/util/abc_global.h"
                      ,0x10e,"int Abc_LitNot(int)");
      }
      begin[lVar9] = begin[lVar9] ^ 1;
      iVar2 = sat_solver_solve(s,begin,begin + iVar2,0,0,0,0);
      if (begin[lVar9] < 0) goto LAB_0059874a;
      begin[lVar9] = begin[lVar9] ^ 1;
      if (iVar2 == -1) {
        begin[lVar9] = iVar1 * 2;
      }
      else {
        Vec_IntPush(pVVar4,(int)lVar9);
      }
      lVar9 = lVar9 + 1;
      pVVar5 = p->vCos;
      uVar7 = (ulong)pVVar5->nSize;
    } while (lVar9 < (long)(uVar7 - (long)p->nRegs));
  }
  sat_solver_delete(s);
  if (p_01->pArray != (int *)0x0) {
    free(p_01->pArray);
    p_01->pArray = (int *)0x0;
  }
  free(p_01);
  piVar3 = pVVar4->pArray;
  if (pVVar4->nSize != p->vCos->nSize - p->nRegs) {
    pGVar6 = Gia_ManDupCones(p,piVar3,pVVar4->nSize,0);
    if (piVar3 != (int *)0x0) {
      free(piVar3);
      pVVar4->pArray = (int *)0x0;
    }
    free(pVVar4);
    return pGVar6;
  }
  if (piVar3 != (int *)0x0) {
    free(piVar3);
    pVVar4->pArray = (int *)0x0;
  }
  free(pVVar4);
  pGVar6 = Gia_ManDup(p);
  return pGVar6;
}

Assistant:

ABC_NAMESPACE_IMPL_START


////////////////////////////////////////////////////////////////////////
///                        DECLARATIONS                              ///
////////////////////////////////////////////////////////////////////////

////////////////////////////////////////////////////////////////////////
///                     FUNCTION DEFINITIONS                         ///
////////////////////////////////////////////////////////////////////////

/**Function*************************************************************

  Synopsis    []

  Description []
               
  SideEffects []

  SeeAlso     []

***********************************************************************/
Gia_Man_t * Gia_ManDropContained( Gia_Man_t * p )
{
    Gia_Man_t * pNew;
    Aig_Man_t * pMan = Gia_ManToAigSimple( p );
    Cnf_Dat_t * pDat = Cnf_Derive( pMan, Gia_ManPoNum(p) );
    Gia_Obj_t * pObj;
    Vec_Int_t * vLits, * vKeep;
    sat_solver * pSat;
    int ConstLit = Abc_Var2Lit(pDat->pVarNums[0], 0);
    int i, status;//, Count = 0;
    Aig_ManStop( pMan );

    vLits = Vec_IntAlloc( Gia_ManPoNum(p) );
    Gia_ManForEachPo( p, pObj, i )
    {
        int iObj = Gia_ObjId( p, pObj );
        Vec_IntPush( vLits, Abc_Var2Lit(pDat->pVarNums[iObj], 1) );
    }

    // start the SAT solver
    pSat = sat_solver_new();
    sat_solver_setnvars( pSat, pDat->nVars );
    for ( i = 0; i < pDat->nClauses; i++ )
    {
        if ( !sat_solver_addclause( pSat, pDat->pClauses[i], pDat->pClauses[i+1] ) )
        {
            Cnf_DataFree( pDat );
            sat_solver_delete( pSat );
            Vec_IntFree( vLits );
            return NULL;
        }
    }
    Cnf_DataFree( pDat );
    status = sat_solver_simplify( pSat );
    if ( status == 0 )
    {
        sat_solver_delete( pSat );
        Vec_IntFree( vLits );
        return NULL;
    }

    // iterate over POs
    vKeep = Vec_IntAlloc( Gia_ManPoNum(p) );
    Gia_ManForEachPo( p, pObj, i )
    {
        Vec_IntWriteEntry( vLits, i, Abc_LitNot(Vec_IntEntry(vLits,i)) );
        status = sat_solver_solve( pSat, Vec_IntArray(vLits), Vec_IntArray(vLits) + Vec_IntSize(vLits), 0, 0, 0, 0 );
        Vec_IntWriteEntry( vLits, i, Abc_LitNot(Vec_IntEntry(vLits,i)) );
        if ( status == l_False )
            Vec_IntWriteEntry( vLits, i, ConstLit ); // const1 SAT var is always true
        else 
        {
            assert( status = l_True );
            Vec_IntPush( vKeep, i );
        }
    }
    sat_solver_delete( pSat );
    Vec_IntFree( vLits );
    if ( Vec_IntSize(vKeep) == Gia_ManPoNum(p) )
    {
        Vec_IntFree( vKeep );
        return Gia_ManDup(p);
    }
    pNew = Gia_ManDupCones( p, Vec_IntArray(vKeep), Vec_IntSize(vKeep), 0 );
    Vec_IntFree( vKeep );
    return pNew;
}